

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void Assimp::Write(JSONWriter *out,aiNodeAnim *ai,bool is_elem)

{
  aiVectorKey *paVar1;
  aiNodeAnim *paVar2;
  ulong uVar3;
  aiVectorKey *scl;
  uint n_2;
  aiQuatKey *local_108;
  aiQuatKey *rot;
  uint n_1;
  aiVectorKey *local_d8;
  aiVectorKey *pos;
  uint n;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  aiNodeAnim *paStack_18;
  bool is_elem_local;
  aiNodeAnim *ai_local;
  JSONWriter *out_local;
  
  local_19 = is_elem;
  paStack_18 = ai;
  ai_local = (aiNodeAnim *)out;
  JSONWriter::StartObj(out,is_elem);
  paVar2 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"name",&local_41);
  JSONWriter::Key((JSONWriter *)paVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  JSONWriter::SimpleValue<aiString>((JSONWriter *)ai_local,&paStack_18->mNodeName);
  paVar2 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"prestate",&local_79);
  JSONWriter::Key((JSONWriter *)paVar2,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  JSONWriter::SimpleValue<aiAnimBehaviour>((JSONWriter *)ai_local,&paStack_18->mPreState);
  paVar2 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"poststate",&local_a1);
  JSONWriter::Key((JSONWriter *)paVar2,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  JSONWriter::SimpleValue<aiAnimBehaviour>((JSONWriter *)ai_local,&paStack_18->mPostState);
  paVar2 = ai_local;
  if (paStack_18->mNumPositionKeys != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&n,"positionkeys",(allocator<char> *)((long)&pos + 7));
    JSONWriter::Key((JSONWriter *)paVar2,(string *)&n);
    std::__cxx11::string::~string((string *)&n);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
    JSONWriter::StartArray((JSONWriter *)ai_local,false);
    for (pos._0_4_ = 0; (uint)pos < paStack_18->mNumPositionKeys; pos._0_4_ = (uint)pos + 1) {
      local_d8 = paStack_18->mPositionKeys + (uint)pos;
      JSONWriter::StartArray((JSONWriter *)ai_local,true);
      JSONWriter::Element<double>((JSONWriter *)ai_local,&local_d8->mTime);
      Write((JSONWriter *)ai_local,&local_d8->mValue,true);
      JSONWriter::EndArray((JSONWriter *)ai_local);
    }
    JSONWriter::EndArray((JSONWriter *)ai_local);
  }
  paVar2 = ai_local;
  if (paStack_18->mNumRotationKeys != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&n_1,"rotationkeys",(allocator<char> *)((long)&rot + 7));
    JSONWriter::Key((JSONWriter *)paVar2,(string *)&n_1);
    std::__cxx11::string::~string((string *)&n_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rot + 7));
    JSONWriter::StartArray((JSONWriter *)ai_local,false);
    for (rot._0_4_ = 0; (uint)rot < paStack_18->mNumRotationKeys; rot._0_4_ = (uint)rot + 1) {
      local_108 = paStack_18->mRotationKeys + (uint)rot;
      JSONWriter::StartArray((JSONWriter *)ai_local,true);
      JSONWriter::Element<double>((JSONWriter *)ai_local,&local_108->mTime);
      Write((JSONWriter *)ai_local,&local_108->mValue,true);
      JSONWriter::EndArray((JSONWriter *)ai_local);
    }
    JSONWriter::EndArray((JSONWriter *)ai_local);
  }
  paVar2 = ai_local;
  if (paStack_18->mNumScalingKeys != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&n_2,"scalingkeys",(allocator<char> *)((long)&scl + 7));
    JSONWriter::Key((JSONWriter *)paVar2,(string *)&n_2);
    std::__cxx11::string::~string((string *)&n_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&scl + 7));
    JSONWriter::StartArray((JSONWriter *)ai_local,false);
    for (scl._0_4_ = 0; (uint)scl < paStack_18->mNumScalingKeys; scl._0_4_ = (uint)scl + 1) {
      paVar1 = paStack_18->mScalingKeys;
      uVar3 = (ulong)(uint)scl;
      JSONWriter::StartArray((JSONWriter *)ai_local,true);
      JSONWriter::Element<double>((JSONWriter *)ai_local,&paVar1[uVar3].mTime);
      Write((JSONWriter *)ai_local,&paVar1[uVar3].mValue,true);
      JSONWriter::EndArray((JSONWriter *)ai_local);
    }
    JSONWriter::EndArray((JSONWriter *)ai_local);
  }
  JSONWriter::EndObj((JSONWriter *)ai_local);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiNodeAnim& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("name");
    out.SimpleValue(ai.mNodeName);

    out.Key("prestate");
    out.SimpleValue(ai.mPreState);

    out.Key("poststate");
    out.SimpleValue(ai.mPostState);

    if (ai.mNumPositionKeys) {
        out.Key("positionkeys");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumPositionKeys; ++n) {
            const aiVectorKey& pos = ai.mPositionKeys[n];
            out.StartArray(true);
            out.Element(pos.mTime);
            Write(out, pos.mValue);
            out.EndArray();
        }
        out.EndArray();
    }

    if (ai.mNumRotationKeys) {
        out.Key("rotationkeys");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumRotationKeys; ++n) {
            const aiQuatKey& rot = ai.mRotationKeys[n];
            out.StartArray(true);
            out.Element(rot.mTime);
            Write(out, rot.mValue);
            out.EndArray();
        }
        out.EndArray();
    }

    if (ai.mNumScalingKeys) {
        out.Key("scalingkeys");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumScalingKeys; ++n) {
            const aiVectorKey& scl = ai.mScalingKeys[n];
            out.StartArray(true);
            out.Element(scl.mTime);
            Write(out, scl.mValue);
            out.EndArray();
        }
        out.EndArray();
    }
    out.EndObj();
}